

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

char * picnic_get_param_name(picnic_params_t parameters)

{
  picnic_params_t parameters_local;
  char *local_8;
  
  switch(parameters) {
  case Picnic_L1_FS:
    local_8 = "Picnic_L1_FS";
    break;
  case Picnic_L1_UR:
    local_8 = "Picnic_L1_UR";
    break;
  case Picnic_L3_FS:
    local_8 = "Picnic_L3_FS";
    break;
  case Picnic_L3_UR:
    local_8 = "Picnic_L3_UR";
    break;
  case Picnic_L5_FS:
    local_8 = "Picnic_L5_FS";
    break;
  case Picnic_L5_UR:
    local_8 = "Picnic_L5_UR";
    break;
  case Picnic3_L1:
    local_8 = "Picnic3_L1";
    break;
  case Picnic3_L3:
    local_8 = "Picnic3_L3";
    break;
  case Picnic3_L5:
    local_8 = "Picnic3_L5";
    break;
  case Picnic_L1_full:
    local_8 = "Picnic_L1_full";
    break;
  case Picnic_L3_full:
    local_8 = "Picnic_L3_full";
    break;
  case Picnic_L5_full:
    local_8 = "Picnic_L5_full";
    break;
  default:
    local_8 = "Unknown parameter set";
  }
  return local_8;
}

Assistant:

const char* PICNIC_CALLING_CONVENTION picnic_get_param_name(picnic_params_t parameters) {
  switch (parameters) {
  case Picnic_L1_FS:
    return "Picnic_L1_FS";
  case Picnic_L1_UR:
    return "Picnic_L1_UR";
  case Picnic_L3_FS:
    return "Picnic_L3_FS";
  case Picnic_L3_UR:
    return "Picnic_L3_UR";
  case Picnic_L5_FS:
    return "Picnic_L5_FS";
  case Picnic_L5_UR:
    return "Picnic_L5_UR";
  case Picnic3_L1:
    return "Picnic3_L1";
  case Picnic3_L3:
    return "Picnic3_L3";
  case Picnic3_L5:
    return "Picnic3_L5";
  case Picnic_L1_full:
    return "Picnic_L1_full";
  case Picnic_L3_full:
    return "Picnic_L3_full";
  case Picnic_L5_full:
    return "Picnic_L5_full";
  default:
    return "Unknown parameter set";
  }
}